

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int pushline(lua_State *L,int firstline)

{
  char *pcVar1;
  undefined8 local_230;
  size_t len;
  char buf [512];
  int firstline_local;
  lua_State *L_local;
  
  write_prompt(L,firstline);
  pcVar1 = fgets((char *)&len,0x200,_stdin);
  if (pcVar1 == (char *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    local_230 = strlen((char *)&len);
    if ((local_230 != 0) && (*(char *)((long)&local_230 + local_230 + 7) == '\n')) {
      *(undefined1 *)((long)&local_230 + local_230 + 7) = 0;
    }
    if ((firstline == 0) || ((char)len != '=')) {
      lua_pushstring(L,(char *)&len);
    }
    else {
      lua_pushfstring(L,"return %s",(long)&len + 1);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int pushline(lua_State *L, int firstline)
{
  char buf[LUA_MAXINPUT];
  write_prompt(L, firstline);
  if (fgets(buf, LUA_MAXINPUT, stdin)) {
    size_t len = strlen(buf);
    if (len > 0 && buf[len-1] == '\n')
      buf[len-1] = '\0';
    if (firstline && buf[0] == '=')
      lua_pushfstring(L, "return %s", buf+1);
    else
      lua_pushstring(L, buf);
    return 1;
  }
  return 0;
}